

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryRequirementsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::memory::anon_unknown_0::testImage
          (TestStatus *__return_storage_ptr__,anon_unknown_0 *this,Context *context,
          ImageParams params)

{
  VkImageAspectFlags aspect_00;
  RefData<vk::Handle<(vk::HandleType)9>_> data;
  TestLog *log_00;
  bool bVar1;
  qpTestResult qVar2;
  DeviceInterface *vk_00;
  InstanceInterface *vki_00;
  VkDevice device_00;
  VkPhysicalDevice physDevice_00;
  TestContext *this_00;
  MessageBuilder *pMVar3;
  Handle<(vk::HandleType)9> *pHVar4;
  VkImageCreateInfo *imageInfo_00;
  VkExtent3D VVar5;
  bool local_9a1;
  allocator<char> local_939;
  string local_938;
  byte local_913;
  byte local_912;
  allocator<char> local_911;
  string local_910;
  MessageBuilder local_8f0;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  undefined1 local_720 [8];
  ResultCollector result;
  undefined1 local_6c8 [8];
  VkMemoryRequirements requirements;
  RefData<vk::Handle<(vk::HandleType)9>_> local_690;
  undefined1 local_670 [8];
  Unique<vk::Handle<(vk::HandleType)9>_> image;
  MessageBuilder local_630;
  VkExtent3D local_4b0;
  undefined1 local_4a0 [8];
  VkImageCreateInfo imageInfo;
  bool isCube;
  VkImageUsageFlags actualUsageFlags;
  VkImageCreateFlags actualCreateFlags;
  VkSampleCountFlagBits loopSampleCount;
  VkImageUsageFlags loopUsageFlags;
  VkImageCreateFlags loopCreateFlags;
  VkImageType loopImageType;
  VkFormat loopFormat;
  deUint32 previousMemoryTypeBits;
  VkImageAspectFlags aspect;
  deUint32 loopAspectNdx;
  MessageBuilder local_410;
  int local_290;
  byte local_289;
  deUint32 numCheckedImages;
  bool allPass;
  TestLog *log;
  VkImageAspectFlags allAspects [2];
  VkImageAspectFlags depthStencilAspect;
  VkImageAspectFlags colorAspect;
  deUint32 notInitializedBits;
  VkPhysicalDeviceMemoryProperties memoryProperties;
  VkImageUsageFlags transientFlags;
  VkImageCreateFlags sparseFlags;
  VkPhysicalDevice physDevice;
  VkDevice device;
  InstanceInterface *vki;
  DeviceInterface *vk;
  Context *context_local;
  VkSampleCountFlagBits local_20;
  deUint32 dStack_1c;
  ImageParams params_local;
  
  vk_00 = vkt::Context::getDeviceInterface((Context *)this);
  vki_00 = vkt::Context::getInstanceInterface((Context *)this);
  device_00 = vkt::Context::getDevice((Context *)this);
  physDevice_00 = vkt::Context::getPhysicalDevice((Context *)this);
  memoryProperties.memoryHeaps[0xf]._12_4_ = 7;
  memoryProperties.memoryHeaps[0xf].flags = 0x40;
  local_20 = (VkSampleCountFlagBits)context;
  requireImageSparseFeatures(vki_00,physDevice_00,local_20);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&colorAspect,vki_00,physDevice_00);
  allAspects[1] = 6;
  log = (TestLog *)0x600000001;
  this_00 = vkt::Context::getTestContext((Context *)this);
  _numCheckedImages = tcu::TestContext::getLog(this_00);
  local_289 = 1;
  local_290 = 0;
  tcu::TestLog::operator<<(&local_410,_numCheckedImages,(BeginMessageToken *)&tcu::TestLog::Message)
  ;
  pMVar3 = tcu::MessageBuilder::operator<<
                     (&local_410,
                      (char (*) [69])
                      "Verify memory requirements for the following parameter combinations:");
  tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_410);
  for (previousMemoryTypeBits = 0; previousMemoryTypeBits < 2;
      previousMemoryTypeBits = previousMemoryTypeBits + 1) {
    aspect_00 = allAspects[(ulong)previousMemoryTypeBits - 2];
    loopImageType = ~VK_IMAGE_TYPE_1D;
    for (loopCreateFlags = 1; (int)loopCreateFlags < 0xb9;
        loopCreateFlags = nextEnum<vk::VkFormat>(loopCreateFlags)) {
      bVar1 = isFormatMatchingAspect(loopCreateFlags,aspect_00);
      if (bVar1) {
        if (aspect_00 == 6) {
          loopImageType = ~VK_IMAGE_TYPE_1D;
        }
        for (loopUsageFlags = 0; loopUsageFlags != 3;
            loopUsageFlags = nextEnum<vk::VkImageType>(loopUsageFlags)) {
          for (loopSampleCount = 0; loopSampleCount < (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_1_BIT)
              ; loopSampleCount = nextFlagExcluding<unsigned_int>(loopSampleCount,7)) {
            for (actualCreateFlags = 1; actualCreateFlags < 0x81;
                actualCreateFlags = nextFlagExcluding<unsigned_int>(actualCreateFlags,0x40)) {
              for (actualUsageFlags = 1; (int)actualUsageFlags < 0x11;
                  actualUsageFlags = nextFlag<vk::VkSampleCountFlagBits>(actualUsageFlags)) {
                imageInfo.pNext._0_4_ = loopSampleCount | local_20;
                imageInfo._84_4_ = actualCreateFlags | ((byte)params.flags & 1) << 6;
                imageInfo.initialLayout._3_1_ =
                     (undefined1)
                     (((VkSampleCountFlagBits)imageInfo.pNext & VK_SAMPLE_COUNT_16_BIT) >> 4);
                local_4a0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
                imageInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                imageInfo._4_4_ = 0;
                imageInfo.pNext._4_4_ = loopUsageFlags;
                imageInfo.flags = loopCreateFlags;
                VVar5 = makeExtentForImage(loopUsageFlags);
                local_4b0._0_8_ = VVar5._0_8_;
                imageInfo.imageType = local_4b0.width;
                imageInfo.format = local_4b0.height;
                local_4b0.depth = VVar5.depth;
                imageInfo.extent.width = local_4b0.depth;
                imageInfo.extent.height = 1;
                imageInfo.extent.depth = 1;
                if ((imageInfo.initialLayout._3_1_ & 1) != VK_IMAGE_LAYOUT_UNDEFINED >> 0x18) {
                  imageInfo.extent.depth = 6;
                }
                imageInfo.mipLevels = actualUsageFlags;
                dStack_1c = (deUint32)((ulong)context >> 0x20);
                imageInfo.arrayLayers = dStack_1c;
                imageInfo.samples = imageInfo._84_4_;
                imageInfo.tiling = VK_IMAGE_TILING_OPTIMAL;
                imageInfo.usage = 0;
                imageInfo.queueFamilyIndexCount = 0;
                imageInfo._68_4_ = 0;
                imageInfo.pQueueFamilyIndices._0_4_ = 0;
                local_4b0 = VVar5;
                bVar1 = isImageSupported(vki_00,physDevice_00,(VkImageCreateInfo *)local_4a0);
                if (bVar1) {
                  tcu::TestLog::operator<<
                            (&local_630,_numCheckedImages,
                             (BeginMessageToken *)&tcu::TestLog::Message);
                  pMVar3 = tcu::MessageBuilder::operator<<(&local_630,(char (*) [3])0x130dad8);
                  memory::(anonymous_namespace)::getImageInfoString_abi_cxx11_
                            ((string *)
                             &image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                              m_allocator,(_anonymous_namespace_ *)local_4a0,imageInfo_00);
                  pMVar3 = tcu::MessageBuilder::operator<<
                                     (pMVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&image.super_RefBase<vk::Handle<(vk::HandleType)9>_>
                                                 .m_data.deleter.m_allocator);
                  tcu::MessageBuilder::operator<<
                            (pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::string::~string
                            ((string *)
                             &image.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.
                              m_allocator);
                  tcu::MessageBuilder::~MessageBuilder(&local_630);
                  local_290 = local_290 + 1;
                  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)
                                    &requirements.memoryTypeBits,vk_00,device_00,
                                    (VkImageCreateInfo *)local_4a0,(VkAllocationCallbacks *)0x0);
                  ::vk::refdetails::Move::operator_cast_to_RefData
                            (&local_690,(Move *)&requirements.memoryTypeBits);
                  data.deleter.m_deviceIface = local_690.deleter.m_deviceIface;
                  data.object.m_internal = local_690.object.m_internal;
                  data.deleter.m_device = local_690.deleter.m_device;
                  data.deleter.m_allocator = local_690.deleter.m_allocator;
                  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::Unique
                            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_670,data);
                  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)9>_>::~Move
                            ((Move<vk::Handle<(vk::HandleType)9>_> *)&requirements.memoryTypeBits);
                  pHVar4 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::operator*
                                     ((RefBase<vk::Handle<(vk::HandleType)9>_> *)local_670);
                  result.m_message.field_2._8_8_ = pHVar4->m_internal;
                  ::vk::getImageMemoryRequirements
                            ((VkMemoryRequirements *)local_6c8,vk_00,device_00,
                             (VkImage)result.m_message.field_2._8_8_);
                  log_00 = _numCheckedImages;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_740,"ERROR: ",&local_741);
                  tcu::ResultCollector::ResultCollector
                            ((ResultCollector *)local_720,log_00,&local_740);
                  std::__cxx11::string::~string((string *)&local_740);
                  std::allocator<char>::~allocator(&local_741);
                  verifyImageRequirements
                            ((ResultCollector *)local_720,
                             (VkPhysicalDeviceMemoryProperties *)&colorAspect,
                             (VkMemoryRequirements *)local_6c8,(VkImageCreateInfo *)local_4a0);
                  local_9a1 = loopImageType == ~VK_IMAGE_TYPE_1D ||
                              (VkImageType)requirements.alignment == loopImageType;
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_768,
                             "memoryTypeBits differ from the ones in the previous image configuration"
                             ,&local_769);
                  tcu::ResultCollector::check((ResultCollector *)local_720,local_9a1,&local_768);
                  std::__cxx11::string::~string((string *)&local_768);
                  std::allocator<char>::~allocator(&local_769);
                  qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_720);
                  if (qVar2 != QP_TEST_RESULT_PASS) {
                    local_289 = 0;
                  }
                  loopImageType = (VkImageType)requirements.alignment;
                  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_720);
                  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)9>_>::~Unique
                            ((Unique<vk::Handle<(vk::HandleType)9>_> *)local_670);
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_290 == 0) {
    tcu::TestLog::operator<<
              (&local_8f0,_numCheckedImages,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_8f0,
                        (char (*) [60])"NOTE: No supported image configurations -- nothing to check"
                       );
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_8f0);
  }
  local_912 = 0;
  local_913 = 0;
  if ((local_289 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_938,"Some memory requirements were incorrect",&local_939);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_938);
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator(&local_939);
  }
  else {
    std::allocator<char>::allocator();
    local_912 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"Pass",&local_911);
    local_913 = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_910);
  }
  if ((local_913 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_910);
  }
  if ((local_912 & 1) != 0) {
    std::allocator<char>::~allocator(&local_911);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus testImage (Context& context, const ImageParams params)
{
	const DeviceInterface&		vk				= context.getDeviceInterface();
	const InstanceInterface&	vki				= context.getInstanceInterface();
	const VkDevice				device			= context.getDevice();
	const VkPhysicalDevice		physDevice		= context.getPhysicalDevice();
	const VkImageCreateFlags	sparseFlags		= VK_IMAGE_CREATE_SPARSE_BINDING_BIT | VK_IMAGE_CREATE_SPARSE_RESIDENCY_BIT | VK_IMAGE_CREATE_SPARSE_ALIASED_BIT;
	const VkImageUsageFlags		transientFlags	= VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT;

	requireImageSparseFeatures(vki, physDevice, params.flags);

	const VkPhysicalDeviceMemoryProperties	memoryProperties		= getPhysicalDeviceMemoryProperties(vki, physDevice);
	const deUint32							notInitializedBits		= ~0u;
	const VkImageAspectFlags				colorAspect				= VK_IMAGE_ASPECT_COLOR_BIT;
	const VkImageAspectFlags				depthStencilAspect		= VK_IMAGE_ASPECT_DEPTH_BIT | VK_IMAGE_ASPECT_STENCIL_BIT;
	const VkImageAspectFlags				allAspects[2]			= { colorAspect, depthStencilAspect };
	tcu::TestLog&							log						= context.getTestContext().getLog();
	bool									allPass					= true;
	deUint32								numCheckedImages		= 0u;

	log << tcu::TestLog::Message << "Verify memory requirements for the following parameter combinations:" << tcu::TestLog::EndMessage;

	for (deUint32 loopAspectNdx = 0u; loopAspectNdx < DE_LENGTH_OF_ARRAY(allAspects); ++loopAspectNdx)
	{
		const VkImageAspectFlags	aspect					= allAspects[loopAspectNdx];
		deUint32					previousMemoryTypeBits	= notInitializedBits;

		for (VkFormat loopFormat = VK_FORMAT_R4G4_UNORM_PACK8; loopFormat <= VK_FORMAT_ASTC_12x12_SRGB_BLOCK; loopFormat = nextEnum(loopFormat))
		if  (isFormatMatchingAspect(loopFormat, aspect))
		{
			// memoryTypeBits may differ between depth/stencil formats
			if (aspect == depthStencilAspect)
				previousMemoryTypeBits = notInitializedBits;

			for (VkImageType			loopImageType	= VK_IMAGE_TYPE_1D;					loopImageType	!= VK_IMAGE_TYPE_LAST;					loopImageType	= nextEnum(loopImageType))
			for (VkImageCreateFlags		loopCreateFlags	= (VkImageCreateFlags)0;			loopCreateFlags	<= VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT;	loopCreateFlags	= nextFlagExcluding(loopCreateFlags, sparseFlags))
			for (VkImageUsageFlags		loopUsageFlags	= VK_IMAGE_USAGE_TRANSFER_SRC_BIT;	loopUsageFlags	<= VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;	loopUsageFlags	= nextFlagExcluding(loopUsageFlags, transientFlags))
			for (VkSampleCountFlagBits	loopSampleCount	= VK_SAMPLE_COUNT_1_BIT;			loopSampleCount	<= VK_SAMPLE_COUNT_16_BIT;				loopSampleCount	= nextFlag(loopSampleCount))
			{
				const VkImageCreateFlags	actualCreateFlags	= loopCreateFlags | params.flags;
				const VkImageUsageFlags		actualUsageFlags	= loopUsageFlags  | (params.transient ? VK_IMAGE_USAGE_TRANSIENT_ATTACHMENT_BIT : (VkImageUsageFlagBits)0);
				const bool					isCube				= (actualCreateFlags & VK_IMAGE_CREATE_CUBE_COMPATIBLE_BIT) != 0u;
				const VkImageCreateInfo		imageInfo			=
				{
					VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,		// VkStructureType          sType;
					DE_NULL,									// const void*              pNext;
					actualCreateFlags,							// VkImageCreateFlags       flags;
					loopImageType,								// VkImageType              imageType;
					loopFormat,									// VkFormat                 format;
					makeExtentForImage(loopImageType),			// VkExtent3D               extent;
					1u,											// uint32_t                 mipLevels;
					(isCube ? 6u : 1u),							// uint32_t                 arrayLayers;
					loopSampleCount,							// VkSampleCountFlagBits    samples;
					params.tiling,								// VkImageTiling            tiling;
					actualUsageFlags,							// VkImageUsageFlags        usage;
					VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode            sharingMode;
					0u,											// uint32_t                 queueFamilyIndexCount;
					DE_NULL,									// const uint32_t*          pQueueFamilyIndices;
					VK_IMAGE_LAYOUT_UNDEFINED,					// VkImageLayout            initialLayout;
				};

				if (!isImageSupported(vki, physDevice, imageInfo))
					continue;

				log << tcu::TestLog::Message << "- " << getImageInfoString(imageInfo) << tcu::TestLog::EndMessage;
				++numCheckedImages;

				const Unique<VkImage>		image			(createImage(vk, device, &imageInfo));
				const VkMemoryRequirements	requirements	= getImageMemoryRequirements(vk, device, *image);
				tcu::ResultCollector		result			(log, "ERROR: ");

				verifyImageRequirements(result, memoryProperties, requirements, imageInfo);

				// For the same tiling, transient usage, and sparse flags, (and format, if D/S) memoryTypeBits must be the same for all images
				result.check((previousMemoryTypeBits == notInitializedBits) || (requirements.memoryTypeBits == previousMemoryTypeBits),
								"memoryTypeBits differ from the ones in the previous image configuration");

				if (result.getResult() != QP_TEST_RESULT_PASS)
					allPass = false;

				previousMemoryTypeBits = requirements.memoryTypeBits;
			}
		}
	}

	if (numCheckedImages == 0u)
		log << tcu::TestLog::Message << "NOTE: No supported image configurations -- nothing to check" << tcu::TestLog::EndMessage;

	return allPass ? tcu::TestStatus::pass("Pass") : tcu::TestStatus::fail("Some memory requirements were incorrect");
}